

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

float Vector3Angle(Vector3 v1,Vector3 v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  
  fVar6 = v2.z;
  fVar3 = v1.z;
  fVar1 = v1.x;
  fVar2 = v1.y;
  fVar4 = v2.x;
  fVar5 = v2.y;
  fVar7 = fVar2 * fVar6 - fVar5 * fVar3;
  fVar8 = fVar3 * fVar4 - fVar1 * fVar6;
  fVar9 = fVar1 * fVar5 - fVar4 * fVar2;
  fVar1 = atan2f(SQRT(fVar9 * fVar9 + fVar7 * fVar7 + fVar8 * fVar8),
                 fVar3 * fVar6 + fVar5 * fVar2 + fVar1 * fVar4);
  return fVar1;
}

Assistant:

RMAPI float Vector3Angle(Vector3 v1, Vector3 v2)
{
    float result = 0.0f;

    Vector3 cross = { v1.y*v2.z - v1.z*v2.y, v1.z*v2.x - v1.x*v2.z, v1.x*v2.y - v1.y*v2.x };
    float len = sqrtf(cross.x*cross.x + cross.y*cross.y + cross.z*cross.z);
    float dot = (v1.x*v2.x + v1.y*v2.y + v1.z*v2.z);
    result = atan2f(len, dot);

    return result;
}